

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

char * GetenvBeforeMain(char *name)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  char *endp;
  char *p;
  long *plStack_28;
  int fd;
  char **p_1;
  int namelen;
  char *name_local;
  
  sVar3 = slow_strlen(name);
  iVar1 = (int)sVar3;
  if (___environ != (long *)0x0) {
    plStack_28 = ___environ;
    while( true ) {
      if (*plStack_28 == 0) {
        return (char *)0x0;
      }
      iVar2 = slow_memcmp((void *)*plStack_28,name,(long)iVar1);
      if ((iVar2 == 0) && (*(char *)(*plStack_28 + (long)iVar1) == '=')) break;
      plStack_28 = plStack_28 + 1;
    }
    return (char *)(*plStack_28 + (long)iVar1 + 1);
  }
  if (GetenvBeforeMain::envbuf[0] == '\0') {
    uVar4 = syscall(2,"/proc/self/environ",0);
    if (((int)uVar4 == -1) ||
       (lVar5 = syscall(0,uVar4 & 0xffffffff,GetenvBeforeMain::envbuf,0x3ffe), lVar5 < 0)) {
      RAW_VLOG(1,
               "Unable to open /proc/self/environ, falling back on getenv(\"%s\"), which may not work"
               ,name);
      if ((int)uVar4 != -1) {
        syscall(3,uVar4 & 0xffffffff);
      }
      pcVar6 = getenv(name);
      return pcVar6;
    }
    syscall(3);
  }
  endp = GetenvBeforeMain::envbuf;
  while( true ) {
    if (*endp == '\0') {
      return (char *)0x0;
    }
    pcVar6 = slow_memchr(endp,0,0x4000 - (long)(endp + -0x365760));
    if (pcVar6 == (char *)0x0) break;
    iVar2 = slow_memcmp(endp,name,(long)iVar1);
    if ((iVar2 == 0) && (endp[iVar1] == '=')) {
      return endp + (long)iVar1 + 1;
    }
    endp = pcVar6 + 1;
  }
  return (char *)0x0;
}

Assistant:

const char* GetenvBeforeMain(const char* name) {
  const int namelen = slow_strlen(name);
#if defined(HAVE___ENVIRON)   // if we have it, it's declared in unistd.h
  if (__environ) {            // can exist but be nullptr, if statically linked
    for (char** p = __environ; *p; p++) {
      if (!slow_memcmp(*p, name, namelen) && (*p)[namelen] == '=')
        return *p + namelen+1;
    }
    return nullptr;
  }
#endif
  // static is ok because this function should only be called before
  // main(), when we're single-threaded.
  static char envbuf[16<<10];
  if (*envbuf == '\0') {    // haven't read the environ yet
    int fd = safeopen("/proc/self/environ", O_RDONLY);
    // The -2 below guarantees the last two bytes of the buffer will be \0\0
    if (fd == -1 ||           // unable to open the file, fall back onto libc
        saferead(fd, envbuf, sizeof(envbuf) - 2) < 0) { // error reading file
      RAW_VLOG(1, "Unable to open /proc/self/environ, falling back "
               "on getenv(\"%s\"), which may not work", name);
      if (fd != -1) safeclose(fd);
      return getenv(name);
    }
    safeclose(fd);
  }
  const char* p = envbuf;
  while (*p != '\0') {    // will happen at the \0\0 that terminates the buffer
    // proc file has the format NAME=value\0NAME=value\0NAME=value\0...
    const char* endp = (char*)slow_memchr(p, '\0',
                                          sizeof(envbuf) - (p - envbuf));
    if (endp == nullptr)            // this entry isn't NUL terminated
      return nullptr;
    else if (!slow_memcmp(p, name, namelen) && p[namelen] == '=')    // it's a match
      return p + namelen+1;      // point after =
    p = endp + 1;
  }
  return nullptr;                   // env var never found
}